

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  undefined1 local_60 [8];
  RepeatedPtrFieldBase temp;
  LogFinisher local_21;
  
  local_60 = (undefined1  [8])other->arena_;
  if (local_60 == (undefined1  [8])this->arena_) {
    LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x689);
    other_00 = LogMessage::operator<<
                         ((LogMessage *)local_60,"CHECK failed: other->GetArena() != GetArena(): ");
    LogFinisher::operator=(&local_21,other_00);
    LogMessage::~LogMessage((LogMessage *)local_60);
    local_60 = (undefined1  [8])other->arena_;
  }
  temp.arena_ = (Arena *)0x0;
  temp.current_size_ = 0;
  temp.total_size_ = 0;
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            ((RepeatedPtrFieldBase *)local_60,this);
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this);
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this,other);
  InternalSwap(other,(RepeatedPtrFieldBase *)local_60);
  Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            ((RepeatedPtrFieldBase *)local_60);
  ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_60);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArena() != GetArena());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}